

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O1

IRet * __thiscall
vkt::shaderexecutor::Cond<float>::doApply
          (IRet *__return_storage_ptr__,Cond<float> *this,EvalContext *param_1,IArgs *iargs)

{
  double dVar1;
  Interval *pIVar2;
  Interval *pIVar3;
  undefined1 uVar4;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  
  __return_storage_ptr__->m_hasNaN = false;
  __return_storage_ptr__->m_lo = INFINITY;
  __return_storage_ptr__->m_hi = -INFINITY;
  pIVar2 = iargs->a;
  dVar1 = pIVar2->m_lo;
  if ((dVar1 <= 1.0) && (1.0 <= pIVar2->m_hi)) {
    pIVar3 = iargs->b;
    dVar7 = INFINITY;
    if (pIVar3->m_lo <= INFINITY) {
      dVar7 = pIVar3->m_lo;
    }
    dVar8 = -INFINITY;
    if (-INFINITY <= pIVar3->m_hi) {
      dVar8 = pIVar3->m_hi;
    }
    __return_storage_ptr__->m_hasNaN = pIVar3->m_hasNaN;
    __return_storage_ptr__->m_lo = dVar7;
    __return_storage_ptr__->m_hi = dVar8;
  }
  if ((dVar1 <= 0.0) && (0.0 <= pIVar2->m_hi)) {
    pIVar2 = iargs->c;
    uVar4 = true;
    if (__return_storage_ptr__->m_hasNaN == false) {
      uVar4 = (undefined1)*(undefined4 *)pIVar2;
    }
    dVar1 = pIVar2->m_lo;
    dVar7 = pIVar2->m_hi;
    uVar5 = -(ulong)(__return_storage_ptr__->m_lo <= dVar1);
    uVar6 = -(ulong)(dVar7 <= __return_storage_ptr__->m_hi);
    __return_storage_ptr__->m_hasNaN = (bool)uVar4;
    __return_storage_ptr__->m_lo =
         (double)(~uVar5 & (ulong)dVar1 | (ulong)__return_storage_ptr__->m_lo & uVar5);
    __return_storage_ptr__->m_hi =
         (double)(~uVar6 & (ulong)dVar7 | (ulong)__return_storage_ptr__->m_hi & uVar6);
  }
  return __return_storage_ptr__;
}

Assistant:

IRet	doApply	(const EvalContext&, const IArgs& iargs)const
	{
		IRet	ret;

		if (iargs.a.contains(true))
			ret = unionIVal<T>(ret, iargs.b);

		if (iargs.a.contains(false))
			ret = unionIVal<T>(ret, iargs.c);

		return ret;
	}